

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O2

Iterator * __thiscall leveldb::Block::NewIterator(Block *this,Comparator *comparator)

{
  uint32_t num_restarts;
  Iter *this_00;
  Iterator *pIVar1;
  long in_FS_OFFSET;
  Slice local_50;
  Slice local_40;
  Status local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->size_ < 4) {
    local_40.data_ = "bad block contents";
    local_40.size_ = 0x12;
    local_50.data_ = "";
    local_50.size_ = 0;
    Status::Corruption(&local_30,&local_40,&local_50);
    this_00 = (Iter *)NewErrorIterator(&local_30);
    Status::~Status(&local_30);
  }
  else {
    num_restarts = NumRestarts(this);
    if (num_restarts == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pIVar1 = NewEmptyIterator();
        return pIVar1;
      }
      goto LAB_00a4cccb;
    }
    this_00 = (Iter *)operator_new(0x80);
    Iter::Iter(this_00,comparator,this->data_,this->restart_offset_,num_restarts);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return &this_00->super_Iterator;
  }
LAB_00a4cccb:
  __stack_chk_fail();
}

Assistant:

Iterator* Block::NewIterator(const Comparator* comparator) {
  if (size_ < sizeof(uint32_t)) {
    return NewErrorIterator(Status::Corruption("bad block contents"));
  }
  const uint32_t num_restarts = NumRestarts();
  if (num_restarts == 0) {
    return NewEmptyIterator();
  } else {
    return new Iter(comparator, data_, restart_offset_, num_restarts);
  }
}